

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zetMetricCreateFromProgrammableExp2
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,uint32_t parameterCount,
          zet_metric_programmable_param_value_exp_t *pParameterValues,char *pName,char *pDescription
          ,uint32_t *pMetricHandleCount,zet_metric_handle_t *phMetricHandles)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  ze_result_t result;
  ze_result_t zVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  lVar7 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zetMetricCreateFromProgrammableExp2(hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles)"
             ,"");
  if (*(char *)(lVar7 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar7 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(lVar4 + 0x750);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar7 = *(long *)(lVar4 + 0xd30);
    lVar2 = *(long *)(lVar4 + 0xd38);
    lVar6 = lVar2 - lVar7 >> 3;
    if (lVar2 != lVar7) {
      lVar9 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(lVar4 + 0xd30) + lVar9 * 8) + 0x10);
        result = (**(code **)(*plVar3 + 0x3c0))
                           (plVar3,hMetricProgrammable,parameterCount,pParameterValues,pName,
                            pDescription,pMetricHandleCount,phMetricHandles);
        if (result != ZE_RESULT_SUCCESS) goto LAB_001714df;
        lVar9 = lVar9 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar9);
    }
    if ((*(char *)(lVar4 + 4) != '\x01') ||
       (result = ZETHandleLifetimeValidation::zetMetricCreateFromProgrammableExp2Prologue
                           ((ZETHandleLifetimeValidation *)(*(long *)(lVar4 + 0xd48) + 0x10),
                            hMetricProgrammable,parameterCount,pParameterValues,pName,pDescription,
                            pMetricHandleCount,phMetricHandles), result == ZE_RESULT_SUCCESS)) {
      zVar5 = (*pcVar1)(hMetricProgrammable,parameterCount,pParameterValues,pName,pDescription,
                        pMetricHandleCount,phMetricHandles);
      if (lVar2 != lVar7) {
        lVar7 = 0;
        do {
          plVar3 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar7 * 8) + 0x10);
          result = (**(code **)(*plVar3 + 0x3c8))
                             (plVar3,hMetricProgrammable,parameterCount,pParameterValues,pName,
                              pDescription,pMetricHandleCount,phMetricHandles,zVar5);
          if (result != ZE_RESULT_SUCCESS) goto LAB_001714df;
          lVar7 = lVar7 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
      }
      lVar7 = context;
      result = zVar5;
      if ((((zVar5 == ZE_RESULT_SUCCESS) && (phMetricHandles != (zet_metric_handle_t *)0x0)) &&
          (*(char *)(context + 4) != '\0')) && (*pMetricHandleCount != 0)) {
        uVar8 = 0;
        do {
          if (phMetricHandles[uVar8] != (zet_metric_handle_t)0x0) {
            HandleLifetimeValidation::addHandle
                      (*(HandleLifetimeValidation **)(lVar7 + 0xd48),phMetricHandles[uVar8]);
            HandleLifetimeValidation::addDependent
                      (*(HandleLifetimeValidation **)(lVar7 + 0xd48),hMetricProgrammable,
                       phMetricHandles[uVar8]);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < *pMetricHandleCount);
      }
    }
  }
LAB_001714df:
  logAndPropagateResult("zetMetricCreateFromProgrammableExp2",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricCreateFromProgrammableExp2(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        uint32_t parameterCount,                        ///< [in] Count of parameters to set.
        zet_metric_programmable_param_value_exp_t* pParameterValues,///< [in] list of parameter values to be set.
        const char* pName,                              ///< [in] pointer to metric name to be used. Must point to a
                                                        ///< null-terminated character array no longer than ::ZET_MAX_METRIC_NAME.
        const char* pDescription,                       ///< [in] pointer to metric description to be used. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_DESCRIPTION.
        uint32_t* pMetricHandleCount,                   ///< [in,out] Pointer to the number of metric handles.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< number of metric handles available for this programmable.
                                                        ///< if count is greater than the number of metric handles available, then
                                                        ///< the driver shall update the value with the correct number of metric
                                                        ///< handles available.
        zet_metric_handle_t* phMetricHandles            ///< [in,out][optional][range(0,*pMetricHandleCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metric handles.
        )
    {
        context.logger->log_trace("zetMetricCreateFromProgrammableExp2(hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles)");

        auto pfnCreateFromProgrammableExp2 = context.zetDdiTable.MetricExp.pfnCreateFromProgrammableExp2;

        if( nullptr == pfnCreateFromProgrammableExp2 )
            return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricCreateFromProgrammableExp2Prologue( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetMetricCreateFromProgrammableExp2Prologue( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", result);
        }

        auto driver_result = pfnCreateFromProgrammableExp2( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricCreateFromProgrammableExp2Epilogue( hMetricProgrammable, parameterCount, pParameterValues, pName, pDescription, pMetricHandleCount, phMetricHandles ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            for (size_t i = 0; ( nullptr != phMetricHandles) && (i < *pMetricHandleCount); ++i){
                if (phMetricHandles[i]){
                    context.handleLifetime->addHandle( phMetricHandles[i] );
                    context.handleLifetime->addDependent( hMetricProgrammable, phMetricHandles[i] );
                }
            }
        }
        return logAndPropagateResult("zetMetricCreateFromProgrammableExp2", driver_result);
    }